

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O3

string * __thiscall
rlib::sequencer::MmlCompiler::Exception::getMessage_abi_cxx11_
          (string *__return_storage_ptr__,Exception *this,Code code)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  undefined4 in_register_00000014;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_88e;
  less<rlib::sequencer::MmlCompiler::Exception::Code> local_88d;
  Code local_88c [49];
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7a0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_778;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_750;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_728;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_700;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6d8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_688;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_660;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_638;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5c0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_598;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if ((getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)
                                      ::m_abi_cxx11_,this,CONCAT44(in_register_00000014,code)),
        iVar1 != 0)) {
    local_88c[0x30] = 1;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[40],_true>
              (&local_7c8,local_88c + 0x30,&anon_var_dwarf_11373e);
    local_88c[0x2f] = 2;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[37],_true>
              (&local_7a0,local_88c + 0x2f,&anon_var_dwarf_113767);
    local_88c[0x2e] = 3;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
              (&local_778,local_88c + 0x2e,&anon_var_dwarf_113780);
    local_88c[0x2d] = 4;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
              (&local_750,local_88c + 0x2d,&anon_var_dwarf_113799);
    local_88c[0x2c] = 5;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
              (&local_728,local_88c + 0x2c,&anon_var_dwarf_1137b2);
    local_88c[0x2b] = 6;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[43],_true>
              (&local_700,local_88c + 0x2b,&anon_var_dwarf_1137bd);
    local_88c[0x2a] = 7;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[40],_true>
              (&local_6d8,local_88c + 0x2a,&anon_var_dwarf_1137c8);
    local_88c[0x29] = 8;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
              (&local_6b0,local_88c + 0x29,&anon_var_dwarf_1137d3);
    local_88c[0x28] = 9;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
              (&local_688,local_88c + 0x28,&anon_var_dwarf_1137ec);
    local_88c[0x27] = 10;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[72],_true>
              (&local_660,local_88c + 0x27,&anon_var_dwarf_1137f7);
    local_88c[0x26] = 0xb;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
              (&local_638,local_88c + 0x26,&anon_var_dwarf_113810);
    local_88c[0x25] = 0xc;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[66],_true>
              (&local_610,local_88c + 0x25,&anon_var_dwarf_11381b);
    local_88c[0x24] = 0xd;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
              (&local_5e8,local_88c + 0x24,&anon_var_dwarf_113826);
    local_88c[0x23] = 0xe;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
              (&local_5c0,local_88c + 0x23,&anon_var_dwarf_11383f);
    local_88c[0x22] = 0xf;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
              (&local_598,local_88c + 0x22,&anon_var_dwarf_113858);
    local_88c[0x21] = 0x10;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
              (&local_570,local_88c + 0x21,&anon_var_dwarf_113863);
    local_88c[0x20] = 0x11;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[83],_true>
              (&local_548,local_88c + 0x20,&anon_var_dwarf_11387c);
    local_88c[0x1f] = 0x12;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[37],_true>
              (&local_520,local_88c + 0x1f,&anon_var_dwarf_113895);
    local_88c[0x1e] = 0x13;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[51],_true>
              (&local_4f8,local_88c + 0x1e,&anon_var_dwarf_1138a0);
    local_88c[0x1d] = 0x14;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[48],_true>
              (&local_4d0,local_88c + 0x1d,&anon_var_dwarf_1138b9);
    local_88c[0x1c] = 0x15;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[69],_true>
              (&local_4a8,local_88c + 0x1c,&anon_var_dwarf_1138d2);
    local_88c[0x1b] = 0x16;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[63],_true>
              (&local_480,local_88c + 0x1b,&anon_var_dwarf_1138eb);
    local_88c[0x1a] = 0x17;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[72],_true>
              (&local_458,local_88c + 0x1a,&anon_var_dwarf_113904);
    local_88c[0x19] = 0x18;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[42],_true>
              (&local_430,local_88c + 0x19,(char (*) [42])(anon_var_dwarf_1138b9 + 6));
    local_88c[0x18] = 0x19;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[63],_true>
              (&local_408,local_88c + 0x18,(char (*) [63])(anon_var_dwarf_1138d2 + 6));
    local_88c[0x17] = 0x1a;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[53],_true>
              (&local_3e0,local_88c + 0x17,&anon_var_dwarf_113933);
    local_88c[0x16] = 0x1b;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[44],_true>
              (&local_3b8,local_88c + 0x16,&anon_var_dwarf_11394c);
    local_88c[0x15] = 0x1c;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[50],_true>
              (&local_390,local_88c + 0x15,&anon_var_dwarf_113965);
    local_88c[0x14] = 0x1d;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[41],_true>
              (&local_368,local_88c + 0x14,&anon_var_dwarf_11397e);
    local_88c[0x13] = 0x1e;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[56],_true>
              (&local_340,local_88c + 0x13,&anon_var_dwarf_113997);
    local_88c[0x12] = 0x1f;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[47],_true>
              (&local_318,local_88c + 0x12,&anon_var_dwarf_1139b0);
    local_88c[0x11] = 0x20;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
              (&local_2f0,local_88c + 0x11,&anon_var_dwarf_1139c9);
    local_88c[0x10] = 0x21;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[51],_true>
              (&local_2c8,local_88c + 0x10,&anon_var_dwarf_1139d4);
    local_88c[0xf] = 0x22;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
              (&local_2a0,local_88c + 0xf,&anon_var_dwarf_1139df);
    local_88c[0xe] = 0x23;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
              (&local_278,local_88c + 0xe,&anon_var_dwarf_1139f8);
    local_88c[0xd] = 0x24;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[67],_true>
              (&local_250,local_88c + 0xd,&anon_var_dwarf_113a03);
    local_88c[0xc] = 0x25;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
              (&local_228,local_88c + 0xc,(char (*) [46])(anon_var_dwarf_1139df + 6));
    local_88c[0xb] = 0x26;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[61],_true>
              (&local_200,local_88c + 0xb,(char (*) [61])(anon_var_dwarf_113a03 + 6));
    local_88c[10] = 0x27;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[42],_true>
              (&local_1d8,local_88c + 10,&anon_var_dwarf_113a32);
    local_88c[9] = 0x28;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[60],_true>
              (&local_1b0,local_88c + 9,&anon_var_dwarf_113a3d);
    local_88c[8] = 0x29;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[55],_true>
              (&local_188,local_88c + 8,&anon_var_dwarf_113a48);
    local_88c[7] = 0x2a;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[46],_true>
              (&local_160,local_88c + 7,&anon_var_dwarf_113a61);
    local_88c[6] = 0x2b;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[57],_true>
              (&local_138,local_88c + 6,&anon_var_dwarf_113a6c);
    local_88c[5] = 0x2c;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[48],_true>
              (&local_110,local_88c + 5,&anon_var_dwarf_113a77);
    local_88c[4] = 0x2d;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
              (&local_e8,local_88c + 4,&anon_var_dwarf_113a82);
    local_88c[3] = 0x2e;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[88],_true>
              (&local_c0,local_88c + 3,&anon_var_dwarf_113a8d);
    local_88c[2] = 0x2f;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[52],_true>
              (&local_98,local_88c + 2,&anon_var_dwarf_113aa6);
    local_88c[1] = 0x30;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[31],_true>
              (&local_70,local_88c + 1,&anon_var_dwarf_113ab1);
    local_88c[0] = stdEexceptionError;
    std::
    pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<rlib::sequencer::MmlCompiler::Exception::Code,_const_char_(&)[30],_true>
              (&local_48,local_88c,&anon_var_dwarf_113aca);
    __l._M_len = 0x31;
    __l._M_array = &local_7c8;
    std::
    map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_,__l,
          &local_88d,&local_88e);
    lVar4 = -0x7a8;
    paVar5 = &local_48.second.field_2;
    do {
      if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar5->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                        paVar5->_M_allocated_capacity + 1);
      }
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(&paVar5->_M_allocated_capacity + -5);
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0);
    __cxa_atexit(std::
                 map<rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<rlib::sequencer::MmlCompiler::Exception::Code>,_std::allocator<std::pair<const_rlib::sequencer::MmlCompiler::Exception::Code,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~map,&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::
                         m_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::
                         m_abi_cxx11_);
  }
  if (getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_._M_t.
      _M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_.
              _M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_._M_t
             ._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      iVar1 = (int)this;
      if (iVar1 <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar1];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 !=
         &getMessage[abi:cxx11](rlib::sequencer::MmlCompiler::Exception::Code)::m_abi_cxx11_._M_t.
          _M_impl.super__Rb_tree_header) && ((int)p_Var2[1]._M_color <= iVar1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var2[1]._M_parent,
                 (long)&(p_Var2[1]._M_parent)->_M_color + (long)&(p_Var2[1]._M_left)->_M_color);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"unknown","");
  return __return_storage_ptr__;
}

Assistant:

std::string MmlCompiler::Exception::getMessage(Code code) {
	static const std::map<Code, std::string> m = {
		{Code::lengthError,						u8R"(音長の指定に誤りがあります)"},
		{Code::lengthMinusError,				u8R"(音長を負値にはできません)"},
		{Code::commentError,					u8R"(コメント指定に誤りがあります)"},
		{Code::argumentError,					u8R"(関数の引数指定に誤りがあります)"},
		{Code::argumentUnknownError,			u8R"(関数に不明な引数名があります)"},
		{Code::functionCallError,				u8R"(関数呼び出しに誤りがあります)"},
		{Code::unknownNumberError,				u8R"(数値の指定に誤りがあります)"},
		{Code::vCommandError,					u8R"(ベロシティ指定（v コマンド）に誤りがあります)"},
		{Code::vCommandRangeError,				u8R"(ベロシティ指定（v コマンド）の値が範囲外です)"},
		{Code::lCommandError,					u8R"(デフォルト音長指定（l コマンド）に誤りがあります)"},
		{Code::oCommandError,					u8R"(オクターブ指定（o コマンド）に誤りがあります)"},
		{Code::oCommandRangeError,				u8R"(オクターブ指定（o コマンド）の値が範囲外です)"},
		{Code::tCommandRangeError,				u8R"(テンポ指定（t コマンド）に誤りがあります)"},
		{Code::programchangeCommandError,		u8R"(音色指定（@ コマンド）に誤りがあります)"},
		{Code::rCommandRangeError,				u8R"(休符指定（r コマンド）に誤りがあります)"},
		{Code::noteCommandRangeError,			u8R"(音符指定（a～g コマンド）に誤りがあります)"},
		{Code::octaveUpDownCommandError,		u8R"(オクターブアップダウン（ < , > コマンド）に誤りがあります)"},
		{Code::octaveUpDownRangeCommandError,	u8R"(オクターブ値が範囲外です)" },
		{Code::tieCommandError,					u8R"(タイ（^ コマンド）に誤りがあります)"},
		{Code::createPortError,					u8R"(CreatePort コマンドに誤りがあります)"},
		{Code::createPortPortNameError,			u8R"(CreatePort コマンドのポート名指定に誤りがあります)"},
		{Code::createPortDuplicateError,		u8R"(CreatePort コマンドでポート名が重複しています)" },
		{Code::createPortChannelError,			u8R"(CreatePort コマンドのチャンネル指定に誤りがあります)" },
		{Code::portError,						u8R"(Port コマンドに誤りがあります)" },
		{Code::portNameError,					u8R"(Port コマンドのポート名指定に誤りがあります)" },
		{Code::volumeError,						u8R"(Volume コマンドの指定に誤りがあります)" },
		{Code::volumeRangeError,				u8R"(Volume コマンドの値が範囲外です)" },
		{Code::panError,						u8R"(Pan コマンドの指定に誤りがあります)" },
		{Code::panRangeError,					u8R"(Pan コマンドの値が範囲外です)" },
		{Code::pitchBendError,					u8R"(PitchBend コマンドの指定に誤りがあります)" },
		{Code::pitchBendRangeError,				u8R"(PitchBend コマンドの値が範囲外です)" },
		{Code::controlChangeError,				u8R"(ControlChange コマンドの指定に誤りがあります)" },
		{Code::controlChangeRangeError,			u8R"(ControlChange コマンドの値が範囲外です)" },
		{Code::createSequenceError,				u8R"(CreateSequence コマンドに誤りがあります)" },
		{Code::createSequenceDuplicateError,	u8R"(CreateSequence コマンドで名前が重複しています)" },
		{Code::createSequenceNameError,			u8R"(CreateSequence コマンドの名前指定に誤りがあります)" },
		{Code::sequenceError,					u8R"(Sequence コマンドに誤りがあります)" },
		{Code::sequenceNameError,				u8R"(Sequence コマンドの名前指定に誤りがあります)" },
		{Code::metaError,						u8R"(Meta コマンドに誤りがあります)" },
		{Code::metaTypeError,					u8R"(Meta コマンドの type の指定に誤りがあります)" },
		{Code::fineTuneError,					u8R"(FineTune コマンドの指定に誤りがあります)" },
		{Code::fineTuneRangeError,				u8R"(FineTune コマンドの値が範囲外です)" },
		{Code::coarseTuneError,					u8R"(CoarseTune コマンドの指定に誤りがあります)" },
		{Code::coarseTuneRangeError,			u8R"(CoarseTune コマンドの値が範囲外です)" },
		{Code::definePresetFMError,				u8R"(DefinePresetFM コマンドに誤りがあります)" },
		{Code::definePresetFMNoError,			u8R"(DefinePresetFM コマンドのプログラムナンバー指定に誤りがあります)" },
		{Code::definePresetFMRangeError,		u8R"(DefinePresetFM コマンドの値が範囲外です)" },
		{Code::unknownError,					u8R"(解析出来ない書式です)"},
		{Code::stdEexceptionError,				u8R"(std::excption エラーです)"},
	};
	if (auto i = m.find(code); i != m.end()) {
		return i->second;
	}
	assert(false);
	return "unknown";
}